

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O1

EStatusCode __thiscall
PDFDocumentHandler::CopyDirectObjectToIndirectObject
          (PDFDocumentHandler *this,PDFObject *inObject,ObjectIDType inTargetObjectID)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  EStatusCode EVar3;
  EPDFObjectType EVar4;
  OutWritingPolicy writingPolicy;
  ObjectIDTypeList newObjectsToWrite;
  IObjectWritePolicy local_50;
  PDFDocumentHandler *local_48;
  _List_node_base *local_40;
  ObjectIDTypeList local_38;
  
  local_38.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node._M_size =
       0;
  local_50._vptr_IObjectWritePolicy = (_func_int **)&PTR_WriteReference_003ac030;
  local_48 = this;
  local_40 = (_List_node_base *)&local_38;
  local_38.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_38;
  EVar3 = ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inTargetObjectID);
  p_Var2 = local_38.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if ((EVar3 == eSuccess) &&
     (EVar3 = WriteObjectByType(this,inObject,eTokenSeparatorEndLine,&local_50),
     p_Var2 = local_38.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              _M_node.super__List_node_base._M_next, EVar3 == eSuccess)) {
    EVar4 = PDFObject::GetType(inObject);
    if (EVar4 != ePDFObjectStream) {
      ObjectsContext::EndIndirectObject(this->mObjectsContext);
    }
    EVar3 = WriteNewObjects(this,&local_38);
    p_Var2 = local_38.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             _M_node.super__List_node_base._M_next;
  }
  while (p_Var2 != (_List_node_base *)&local_38) {
    p_Var1 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var2->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return EVar3;
}

Assistant:

EStatusCode PDFDocumentHandler::CopyDirectObjectToIndirectObject(PDFObject* inObject,ObjectIDType inTargetObjectID)
{
	EStatusCode status;
	ObjectIDTypeList newObjectsToWrite;
	OutWritingPolicy writingPolicy(this, newObjectsToWrite);

	status = mObjectsContext->StartNewIndirectObject(inTargetObjectID);
	if(status != PDFHummus::eSuccess)
		return status;
	status = WriteObjectByType(inObject,eTokenSeparatorEndLine, &writingPolicy);
	if(PDFHummus::eSuccess == status)
	{
		if(inObject->GetType() != PDFObject::ePDFObjectStream) // write indirect object end for non streams only...cause they take care of writing their own
			mObjectsContext->EndIndirectObject();
		return WriteNewObjects(newObjectsToWrite);
	}
	else
		return status;
}